

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O0

int __thiscall
picojson::input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::ungetc
          (input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *this,int __c,
          FILE *__stream)

{
  runtime_error *this_00;
  undefined4 in_register_00000034;
  input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *this_local;
  
  if (this->last_ch_ != -1) {
    if ((this->ungot_ & 1U) != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10,CONCAT44(in_register_00000034,__c));
      std::runtime_error::runtime_error(this_00,"! ungot_");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this->ungot_ = true;
  }
  return (int)this;
}

Assistant:

void ungetc() {
      if (last_ch_ != -1) {
	PICOJSON_ASSERT(! ungot_);
	ungot_ = true;
      }
    }